

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plg.cpp
# Opt level: O0

int __thiscall rw::PluginList::streamGetSize(PluginList *this,void *object)

{
  Plugin *pPVar1;
  int iVar2;
  Plugin *pPVar3;
  Plugin *p;
  LLLink *lnk;
  LLLink *_next;
  int32 plgsize;
  int32 size;
  void *object_local;
  PluginList *this_local;
  
  _next._4_4_ = 0;
  pPVar1 = (Plugin *)(this->plugins).link.next;
  while( true ) {
    p = pPVar1;
    pPVar1 = *(Plugin **)p;
    pPVar3 = (Plugin *)LinkList::end(&this->plugins);
    if (p == pPVar3) break;
    if ((p[-1].inParentList.next != (LLLink *)0x0) &&
       (iVar2 = (*(code *)p[-1].inParentList.next)
                          (object,*(undefined4 *)&p[-1].copy,*(undefined4 *)((long)&p[-1].copy + 4))
       , 0 < iVar2)) {
      _next._4_4_ = iVar2 + 0xc + _next._4_4_;
    }
  }
  return _next._4_4_;
}

Assistant:

int
PluginList::streamGetSize(void *object)
{
	int32 size = 0;
	int32 plgsize;
	FORLIST(lnk, this->plugins){
		Plugin *p = PLG(lnk);
		if(p->getSize &&
		   (plgsize = p->getSize(object, p->offset, p->size)) > 0)
			size += 12 + plgsize;
	}
	return size;
}